

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileUtilityTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileUtilityTargetGenerator::WriteRuleFiles(cmMakefileUtilityTargetGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratedFileStream *pcVar2;
  cmMakefile *this_00;
  cmGlobalUnixMakefileGenerator3 *pcVar3;
  cmLocalUnixMakefileGenerator3 *pcVar4;
  cmGeneratorTarget *pcVar5;
  pointer pcVar6;
  bool bVar7;
  string *psVar8;
  ostream *poVar9;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar10;
  long lVar11;
  char *path;
  char *pcVar12;
  allocator local_99;
  string hack;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  
  cmMakefileTargetGenerator::CreateRuleFile(&this->super_cmMakefileTargetGenerator);
  pcVar2 = (this->super_cmMakefileTargetGenerator).BuildFileStream;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar2,"# Utility rule file for ",0x18);
  psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar2,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,".\n\n",3);
  if ((this->super_cmMakefileTargetGenerator).NoRuleMessages == false) {
    this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    paVar1 = &hack.field_2;
    hack._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&hack,"CMAKE_MAKE_INCLUDE_FROM_ROOT","");
    bVar7 = cmMakefile::IsOn(this_00,&hack);
    pcVar12 = "";
    if (bVar7) {
      pcVar12 = "$(CMAKE_BINARY_DIR)/";
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)hack._M_dataplus._M_p != paVar1) {
      operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmMakefileTargetGenerator).BuildFileStream;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar2,"# Include the progress variables for this target.\n",0x32);
    pcVar3 = (this->super_cmMakefileTargetGenerator).GlobalGenerator;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)pcVar2,(pcVar3->IncludeDirective)._M_dataplus._M_p,
                        (pcVar3->IncludeDirective)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    lVar11 = 0x14;
    if (!bVar7) {
      lVar11 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar12,lVar11);
    pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar12 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar4);
    std::__cxx11::string::string((string *)&depends,pcVar12,&local_99);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              ((string *)&commands,pcVar4,(string *)&depends,
               &(this->super_cmMakefileTargetGenerator).ProgressFileNameFull);
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              (&hack,(cmSystemTools *)
                     commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,path);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,hack._M_dataplus._M_p,hack._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)hack._M_dataplus._M_p != paVar1) {
      operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
    }
    if (commands.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((commands.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(depends.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((depends.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
  }
  cmMakefileTargetGenerator::WriteTargetBuildRules(&this->super_cmMakefileTargetGenerator);
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar10 = cmGeneratorTarget::GetPreBuildCommands
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
  cmLocalUnixMakefileGenerator3::AppendCustomDepends(pcVar4,&depends,pvVar10);
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar10 = cmGeneratorTarget::GetPostBuildCommands
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
  cmLocalUnixMakefileGenerator3::AppendCustomDepends(pcVar4,&depends,pvVar10);
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar10 = cmGeneratorTarget::GetPreBuildCommands
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
  pcVar5 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar12 = cmLocalGenerator::GetBinaryDirectory
                      ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  std::__cxx11::string::string((string *)&hack,pcVar12,&local_99);
  cmLocalUnixMakefileGenerator3::AppendCustomCommands(pcVar4,&commands,pvVar10,pcVar5,&hack);
  paVar1 = &hack.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hack._M_dataplus._M_p != paVar1) {
    operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
  }
  cmMakefileTargetGenerator::DriveCustomCommands(&this->super_cmMakefileTargetGenerator,&depends);
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar10 = cmGeneratorTarget::GetPostBuildCommands
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
  pcVar5 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar12 = cmLocalGenerator::GetBinaryDirectory
                      ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  std::__cxx11::string::string((string *)&hack,pcVar12,&local_99);
  cmLocalUnixMakefileGenerator3::AppendCustomCommands(pcVar4,&commands,pvVar10,pcVar5,&hack);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hack._M_dataplus._M_p != paVar1) {
    operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
  }
  cmMakefileTargetGenerator::AppendTargetDepends(&this->super_cmMakefileTargetGenerator,&depends);
  cmLocalUnixMakefileGenerator3::AppendRuleDepend
            ((this->super_cmMakefileTargetGenerator).LocalGenerator,&depends,
             (this->super_cmMakefileTargetGenerator).BuildFileNameFull._M_dataplus._M_p);
  if ((depends.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       depends.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pcVar3 = (this->super_cmMakefileTargetGenerator).GlobalGenerator;
    pcVar6 = (pcVar3->EmptyRuleHackDepends)._M_dataplus._M_p;
    hack._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&hack,pcVar6,pcVar6 + (pcVar3->EmptyRuleHackDepends)._M_string_length);
    if (hack._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,&hack);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)hack._M_dataplus._M_p != paVar1) {
      operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pcVar2 = (this->super_cmMakefileTargetGenerator).BuildFileStream;
  psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (pcVar4,(ostream *)pcVar2,(char *)0x0,psVar8,&depends,&commands,true,false);
  psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  cmMakefileTargetGenerator::WriteTargetDriverRule
            (&this->super_cmMakefileTargetGenerator,psVar8,false);
  cmMakefileTargetGenerator::WriteTargetCleanRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetDependRules(&this->super_cmMakefileTargetGenerator);
  (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
    _vptr_cmCommonTargetGenerator[5])(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  return;
}

Assistant:

void cmMakefileUtilityTargetGenerator::WriteRuleFiles()
{
  this->CreateRuleFile();

  *this->BuildFileStream << "# Utility rule file for "
                         << this->GeneratorTarget->GetName() << ".\n\n";

  if (!this->NoRuleMessages) {
    const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")
                          ? "$(CMAKE_BINARY_DIR)/"
                          : "");
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << cmSystemTools::ConvertToOutputPath(
           this->LocalGenerator
             ->MaybeConvertToRelativePath(
               this->LocalGenerator->GetBinaryDirectory(),
               this->ProgressFileNameFull)
             .c_str())
      << "\n\n";
  }

  // write the custom commands for this target
  this->WriteTargetBuildRules();

  // Collect the commands and dependencies.
  std::vector<std::string> commands;
  std::vector<std::string> depends;

  // Utility targets store their rules in pre- and post-build commands.
  this->LocalGenerator->AppendCustomDepends(
    depends, this->GeneratorTarget->GetPreBuildCommands());

  this->LocalGenerator->AppendCustomDepends(
    depends, this->GeneratorTarget->GetPostBuildCommands());

  this->LocalGenerator->AppendCustomCommands(
    commands, this->GeneratorTarget->GetPreBuildCommands(),
    this->GeneratorTarget, this->LocalGenerator->GetBinaryDirectory());

  // Depend on all custom command outputs for sources
  this->DriveCustomCommands(depends);

  this->LocalGenerator->AppendCustomCommands(
    commands, this->GeneratorTarget->GetPostBuildCommands(),
    this->GeneratorTarget, this->LocalGenerator->GetBinaryDirectory());

  // Add dependencies on targets that must be built first.
  this->AppendTargetDepends(depends);

  // Add a dependency on the rule file itself.
  this->LocalGenerator->AppendRuleDepend(depends,
                                         this->BuildFileNameFull.c_str());

  // If the rule is empty add the special empty rule dependency needed
  // by some make tools.
  if (depends.empty() && commands.empty()) {
    std::string hack = this->GlobalGenerator->GetEmptyRuleHackDepends();
    if (!hack.empty()) {
      depends.push_back(hack);
    }
  }

  // Write the rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, CM_NULLPTR,
                                      this->GeneratorTarget->GetName(),
                                      depends, commands, true);

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(this->GeneratorTarget->GetName(), false);

  // Write clean target
  this->WriteTargetCleanRules();

  // Write the dependency generation rule.  This must be done last so
  // that multiple output pair information is available.
  this->WriteTargetDependRules();

  // close the streams
  this->CloseFileStreams();
}